

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O3

void __thiscall
duckdb::HashAggregateLocalSinkState::~HashAggregateLocalSinkState(HashAggregateLocalSinkState *this)

{
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__HashAggregateLocalSinkState_02466240;
  ::std::
  vector<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregateFilterData,_std::default_delete<duckdb::AggregateFilterData>,_true>_>_>
             *)&this->filter_set);
  ::std::
  vector<duckdb::HashAggregateGroupingLocalState,_std::allocator<duckdb::HashAggregateGroupingLocalState>_>
  ::~vector(&(this->grouping_states).
             super_vector<duckdb::HashAggregateGroupingLocalState,_std::allocator<duckdb::HashAggregateGroupingLocalState>_>
           );
  DataChunk::~DataChunk(&this->aggregate_input_chunk);
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__LocalSinkState_024465d8;
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&(this->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            );
  operator_delete(this);
  return;
}

Assistant:

HashAggregateLocalSinkState(const PhysicalHashAggregate &op, ExecutionContext &context) {

		auto &payload_types = op.grouped_aggregate_data.payload_types;
		if (!payload_types.empty()) {
			aggregate_input_chunk.InitializeEmpty(payload_types);
		}

		grouping_states.reserve(op.groupings.size());
		for (auto &grouping : op.groupings) {
			grouping_states.emplace_back(op, grouping, context);
		}
		// The filter set is only needed here for the distinct aggregates
		// the filtering of data for the regular aggregates is done within the hashtable
		vector<AggregateObject> aggregate_objects;
		for (auto &aggregate : op.grouped_aggregate_data.aggregates) {
			auto &aggr = aggregate->Cast<BoundAggregateExpression>();
			aggregate_objects.emplace_back(&aggr);
		}

		filter_set.Initialize(context.client, aggregate_objects, payload_types);
	}